

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<std::map<std::string,_basic_string<char>_>,_(anonymous_namespace)::ErrorCode> *
__thiscall
cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
MapFilter<std::__cxx11::string,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>,(anonymous_namespace)::__1>
          (cmJSONHelper<std::map<std::string,_basic_string<char>_>,_(anonymous_namespace)::ErrorCode>
           *__return_storage_ptr__,ErrorCode param_2,ErrorCode success,
          function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          *param_4)

{
  anon_class_48_4_71e8aacc local_58;
  function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  *local_28;
  function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  *func_local;
  ErrorCode local_18;
  ErrorCode fail_local;
  ErrorCode success_local;
  
  local_58.success = param_2;
  local_58.fail = success;
  local_28 = param_4;
  func_local._4_4_ = success;
  local_18 = param_2;
  _success_local = __return_storage_ptr__;
  std::
  function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  ::function(&local_58.func,param_4);
  std::
  function<(anonymous_namespace)::ErrorCode(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::MapFilter<std::__cxx11::string,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>,(anonymous_namespace)::__1>((anonymous_namespace)::ErrorCode,(anonymous_namespace)::ErrorCode,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>,(anonymous_namespace)::__1)::_lambda(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&,Json::Value_const*)_1_,void>
            ((function<(anonymous_namespace)::ErrorCode(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&,Json::Value_const*)>
              *)__return_storage_ptr__,&local_58);
  MapFilter<std::__cxx11::string,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>,(anonymous_namespace)::$_1>((anonymous_namespace)::ErrorCode,(anonymous_namespace)::ErrorCode,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>,(anonymous_namespace)::$_1)
  ::
  {lambda(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&,Json::Value_const*)#1}
  ::~MapFilter((_lambda_std__map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>__Json__Value_const___1_
                *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<std::map<std::string, T>, E, CallState...> MapFilter(
    E success, E fail, F func, Filter filter)
  {
    return [success, fail, func, filter](std::map<std::string, T>& out,
                                         const Json::Value* value,
                                         CallState&&... state) -> E {
      if (!value) {
        out.clear();
        return success;
      }
      if (!value->isObject()) {
        return fail;
      }
      out.clear();
      for (auto const& key : value->getMemberNames()) {
        if (!filter(key)) {
          continue;
        }
        T t;
        E result = func(t, &(*value)[key], std::forward(state)...);
        if (result != success) {
          return result;
        }
        out[key] = std::move(t);
      }
      return success;
    };
  }